

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2cpp.cpp
# Opt level: O0

string * convertFilename(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  uint local_98;
  uint i;
  string local_70 [8];
  string text;
  ssize_t pos;
  string fpath;
  string *input_local;
  string *temp;
  
  fpath.field_2._8_8_ = input;
  std::__cxx11::string::string((string *)&pos,(string *)input);
  lVar2 = std::__cxx11::string::rfind((char *)&pos,0x105004);
  std::__cxx11::string::string(local_70);
  if (lVar2 == -1) {
    std::__cxx11::string::operator=(local_70,(string *)fpath.field_2._8_8_);
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&i,(ulong)&pos);
    std::__cxx11::string::operator=(local_70,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_98 = 0;
  do {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= local_98) {
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string((string *)&pos);
      return __return_storage_ptr__;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
    if ((*pcVar4 == '.') ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
       *pcVar4 == ' ')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
      iVar1 = isalpha((int)*pcVar4);
      if (iVar1 == 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
        iVar1 = isdigit((int)*pcVar4);
        if (iVar1 == 0) goto LAB_00102741;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
    }
LAB_00102741:
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

std::string convertFilename(const std::string &input) {
    std::string fpath=input;
    ssize_t pos = fpath.rfind("/");
    std::string text;
    if(pos != std::string::npos)
        text = fpath.substr(pos+1, fpath.length()-pos);
    else
        text = input;
    
    std::string temp;
    for(unsigned int i = 0; i < text.length(); ++i) {
        if(text[i] == '.' || temp[i] == ' ')
            temp += '_';
        else if(isalpha(text[i]) || isdigit(text[i]))
            temp += text[i];
    }
    return temp;
}